

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O0

void fs_event_cb_dir_multi_file(uv_fs_event_t *handle,char *filename,int events,int status)

{
  int iVar1;
  int status_local;
  int events_local;
  char *filename_local;
  uv_fs_event_t *handle_local;
  
  fs_event_cb_called = fs_event_cb_called + 1;
  if (handle != &fs_event) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
            ,0xcd,"handle == &fs_event");
    abort();
  }
  if (status == 0) {
    if ((events != 2) && (events != 1)) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
              ,0xcf,"events == UV_CHANGE || events == UV_RENAME");
      abort();
    }
    iVar1 = strncmp(filename,"fsevent-",8);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
              ,0xd1,"strncmp(filename, file_prefix, sizeof(file_prefix) - 1) == 0");
      abort();
    }
    if (fs_event_created + fs_event_removed == 0x10) {
      iVar1 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
                ,0xd9,"0 == uv_timer_start(&timer, fs_event_unlink_files, 1, 0)");
        abort();
      }
    }
    else if (fs_event_cb_called == 0x20) {
      uv_close((uv_handle_t *)&timer,close_cb);
      uv_close((uv_handle_t *)&fs_event,close_cb);
    }
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
          ,0xce,"status == 0");
  abort();
}

Assistant:

static void fs_event_cb_dir_multi_file(uv_fs_event_t* handle,
                                       const char* filename,
                                       int events,
                                       int status) {
  fs_event_cb_called++;
  ASSERT(handle == &fs_event);
  ASSERT(status == 0);
  ASSERT(events == UV_CHANGE || events == UV_RENAME);
  #if defined(__APPLE__) || defined(_WIN32) || defined(__linux__)
  ASSERT(strncmp(filename, file_prefix, sizeof(file_prefix) - 1) == 0);
  #else
  ASSERT(filename == NULL ||
         strncmp(filename, file_prefix, sizeof(file_prefix) - 1) == 0);
  #endif

  if (fs_event_created + fs_event_removed == fs_event_file_count) {
    /* Once we've processed all create events, delete all files */
    ASSERT(0 == uv_timer_start(&timer, fs_event_unlink_files, 1, 0));
  } else if (fs_event_cb_called == 2 * fs_event_file_count) {
    /* Once we've processed all create and delete events, stop watching */
    uv_close((uv_handle_t*) &timer, close_cb);
    uv_close((uv_handle_t*) handle, close_cb);
  }
}